

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# game.cpp
# Opt level: O1

bool __thiscall Game::teamMembers(Game *this,size_t player1,size_t player2)

{
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  _Var1;
  bool bVar2;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_40;
  size_t local_28;
  
  bVar2 = true;
  if (player1 != player2) {
    getTeamMember(&local_40,this,player1);
    local_28 = player2;
    _Var1 = std::
            __find_if<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,__gnu_cxx::__ops::_Iter_equals_val<unsigned_long_const>>
                      (local_40.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                       _M_impl.super__Vector_impl_data._M_start,
                       local_40.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                       _M_impl.super__Vector_impl_data._M_finish);
    bVar2 = _Var1._M_current !=
            local_40.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_finish;
    if (local_40.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_40.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                      _M_impl.super__Vector_impl_data._M_start);
    }
  }
  return bVar2;
}

Assistant:

bool Game::teamMembers(size_t player1, size_t player2) {
    return player1 == player2 || contains(getTeamMember(player1), player2);
}